

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseHead(TidyDocImpl *doc,Node *head,GetTokenMode mode)

{
  TidyTagId TVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  TidyParserMemory data;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  NodeType NVar7;
  Bool BVar8;
  int iVar9;
  Node *node;
  Node *element;
  uint uVar10;
  uint uVar11;
  TidyParserMemory memory;
  Node *pNStack_58;
  undefined8 uStack_40;
  uint uStack_38;
  
  pLVar2 = doc->lexer;
  uVar11 = 0;
  uVar10 = 0;
  if (head == (Node *)0x0) {
    prvTidypopMemory(doc);
    head = pNStack_58;
    uVar11 = uStack_40._4_4_;
    uVar10 = uStack_38;
  }
LAB_001391a0:
  while( true ) {
    node = prvTidyGetToken(doc,IgnoreWhitespace);
    if (node == (Node *)0x0) {
      return (Node *)0x0;
    }
    pDVar3 = node->tag;
    if (pDVar3 == head->tag) break;
    if ((pDVar3 != (Dict *)0x0) && (pDVar3->id == TidyTag_HTML)) {
      NVar7 = node->type;
      goto LAB_001391dd;
    }
LAB_00139204:
    BVar8 = prvTidynodeIsText(node);
    if (BVar8 != no) {
      if ((*(int *)((doc->config).value + 0x3b) != 0) || (*(int *)((doc->config).value + 6) == 1))
      goto LAB_001392dd;
      goto LAB_001392c8;
    }
    if ((node->type != ProcInsTag) ||
       ((node->element == (ctmbstr)0x0 ||
        (iVar9 = prvTidytmbstrcmp(node->element,"xml-stylesheet"), iVar9 != 0)))) goto LAB_00139230;
    prvTidyReport(doc,head,node,0x27e);
    element = prvTidyFindHTML(doc);
    prvTidyInsertNodeBeforeElement(element,node);
  }
  NVar7 = node->type;
  if (NVar7 == EndTag) {
    prvTidyFreeNode(doc,node);
    head->closed = yes;
    return (Node *)0x0;
  }
LAB_001391dd:
  if (NVar7 != StartTag) goto LAB_00139204;
  goto LAB_001391e2;
LAB_00139230:
  BVar8 = InsertMisc(head,node);
  if (BVar8 != no) goto LAB_001391a0;
  if (node->type == DocTypeTag) {
    InsertDocType(doc,head,node);
    goto LAB_001391a0;
  }
  if (node->tag != (Dict *)0x0) {
    if ((node->tag->model & 4) == 0) {
      if (pLVar2->isvoyager != no) {
LAB_001392c8:
        prvTidyReport(doc,head,node,0x27e);
      }
LAB_001392dd:
      prvTidyUngetToken(doc);
      return (Node *)0x0;
    }
    BVar8 = prvTidynodeIsElement(node);
    if (BVar8 != no) {
      if (node->tag != (Dict *)0x0) {
        TVar1 = node->tag->id;
        if (TVar1 == TidyTag_BASE) {
          uVar5 = uVar10 + 1;
          uVar6 = uVar11;
          uVar4 = uVar10;
        }
        else {
          if (TVar1 != TidyTag_TITLE) goto LAB_00139356;
          uVar5 = uVar10;
          uVar6 = uVar11 + 1;
          uVar4 = uVar11;
        }
        uVar11 = uVar6;
        uVar10 = uVar5;
        if (0 < (int)uVar4) {
          prvTidyReport(doc,head,node,0x27f);
        }
      }
LAB_00139356:
      prvTidyInsertNodeAtEnd(head,node);
      uStack_40 = (ulong)uVar11 << 0x20;
      data.original_node = head;
      data.identity = prvTidyParseHead;
      data.reentry_node = node;
      data.reentry_mode = IgnoreWhitespace;
      data.reentry_state = 0;
      data.mode = (undefined4)uStack_40;
      data.register_1 = uStack_40._4_4_;
      data.register_2 = uVar10;
      data._44_4_ = 0;
      prvTidypushMemory(doc,data);
      return node;
    }
  }
LAB_001391e2:
  prvTidyReport(doc,head,node,0x235);
  prvTidyFreeNode(doc,node);
  goto LAB_001391a0;
}

Assistant:

Node* TY_(ParseHead)( TidyDocImpl* doc, Node *head, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    int HasTitle = 0;
    int HasBase = 0;
    DEBUG_LOG_COUNTERS;

    if ( head == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        head = memory.original_node;
        HasTitle = memory.register_1;
        HasBase = memory.register_2;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(head);
    }
    
    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->tag == head->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            head->closed = yes;
            break;
        }

        /* find and discard multiple <head> elements */
        /* find and discard <html> in <head> elements */
        if ((node->tag == head->tag || nodeIsHTML(node)) && node->type == StartTag)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        if (TY_(nodeIsText)(node))
        {
            /*\ Issue #132 - avoid warning for missing body tag,
             *  if configured to --omit-otpional-tags yes
             *  Issue #314 - and if --show-body-only
            \*/
            if (!cfgBool( doc, TidyOmitOptionalTags ) &&
                !showingBodyOnly(doc) )
            {
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            }
            TY_(UngetToken)( doc );
            break;
        }

        if (node->type == ProcInsTag && node->element &&
            TY_(tmbstrcmp)(node->element, "xml-stylesheet") == 0)
        {
            TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN);
            TY_(InsertNodeBeforeElement)(TY_(FindHTML)(doc), node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(head, node))
            continue;

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, head, node);
            continue;
        }

        /* discard unknown tags */
        if (node->tag == NULL)
        {
            TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
         if it doesn't belong in the head then
         treat as implicit end of head and deal
         with as part of the body
        */
        if (!(node->tag->model & CM_HEAD))
        {
            /* #545067 Implicit closing of head broken - warn only for XHTML input */
            if ( lexer->isvoyager )
                TY_(Report)(doc, head, node, TAG_NOT_ALLOWED_IN );
            TY_(UngetToken)( doc );
            break;
        }

        if (TY_(nodeIsElement)(node))
        {
            if ( nodeIsTITLE(node) )
            {
                ++HasTitle;

                if (HasTitle > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }
            else if ( nodeIsBASE(node) )
            {
                ++HasBase;

                if (HasBase > 1)
                    TY_(Report)(doc, head, node,
                                     head ?
                                     TOO_MANY_ELEMENTS_IN : TOO_MANY_ELEMENTS);
            }

            TY_(InsertNodeAtEnd)(head, node);

            {
                TidyParserMemory memory = {0};
                memory.identity = TY_(ParseHead);
                memory.original_node = head;
                memory.reentry_node = node;
                memory.register_1 = HasTitle;
                memory.register_2 = HasBase;
                TY_(pushMemory)( doc, memory );
                DEBUG_LOG_EXIT_WITH_NODE(node);
                return node;
            }
        }

        /* discard unexpected text nodes and end tags */
        TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG_EXIT;
    return NULL;
}